

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O1

interval_t duckdb::ToYearsOperator::Operation<int,duckdb::interval_t>(int input)

{
  interval_t iVar1;
  bool bVar2;
  OutOfRangeException *this;
  undefined1 auVar3 [12];
  int result_1;
  interval_t result;
  int local_5c;
  string local_58;
  int local_38;
  undefined4 uStack_34;
  int64_t local_30;
  
  bVar2 = duckdb::TryCast::Operation<int,int>(input,&local_5c,false);
  if (!bVar2) {
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<int,int>(&local_58,(duckdb *)(ulong)(uint)input,auVar3._8_4_);
    duckdb::InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_58);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  uStack_34 = 0;
  local_30 = 0;
  bVar2 = duckdb::TryMultiplyOperator::Operation<int,int,int>(local_5c,0xc,&local_38);
  if (bVar2) {
    iVar1.days = uStack_34;
    iVar1.months = local_38;
    iVar1.micros = local_30;
    return iVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Interval value %d years out of range","");
  OutOfRangeException::OutOfRangeException<int>(this,&local_58,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.days = 0;
		result.micros = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_YEAR,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d years out of range", input);
		}
		return result;
	}